

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_string_substring(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  int start;
  int iVar1;
  JSValueUnion p;
  JSValue v;
  JSValue JVar2;
  int b;
  int a;
  
  v = JS_ToStringCheckObject(ctx,this_val);
  p = v.u;
  if ((int)v.tag == 6) {
    return v;
  }
  iVar1 = JS_ToInt32Clamp(ctx,&a,*argv,0,*(uint *)((long)p.ptr + 4) & 0x7fffffff,0);
  if (iVar1 == 0) {
    b = *(uint *)((long)p.ptr + 4) & 0x7fffffff;
    if (((int)argv[1].tag == 3) ||
       (JVar2.tag = argv[1].tag, JVar2.u.ptr = argv[1].u.ptr,
       iVar1 = JS_ToInt32Clamp(ctx,&b,JVar2,0,b,0), iVar1 == 0)) {
      iVar1 = b;
      if (b < a) {
        iVar1 = a;
      }
      start = b;
      if (a < b) {
        start = a;
      }
      JVar2 = js_sub_string(ctx,(JSString *)p.ptr,start,iVar1);
      goto LAB_0015828b;
    }
  }
  JVar2 = (JSValue)(ZEXT816(6) << 0x40);
LAB_0015828b:
  JS_FreeValue(ctx,v);
  return JVar2;
}

Assistant:

static JSValue js_string_substring(JSContext *ctx, JSValueConst this_val,
                                   int argc, JSValueConst *argv)
{
    JSValue str, ret;
    int a, b, start, end;
    JSString *p;

    str = JS_ToStringCheckObject(ctx, this_val);
    if (JS_IsException(str))
        return str;
    p = JS_VALUE_GET_STRING(str);
    if (JS_ToInt32Clamp(ctx, &a, argv[0], 0, p->len, 0)) {
        JS_FreeValue(ctx, str);
        return JS_EXCEPTION;
    }
    b = p->len;
    if (!JS_IsUndefined(argv[1])) {
        if (JS_ToInt32Clamp(ctx, &b, argv[1], 0, p->len, 0)) {
            JS_FreeValue(ctx, str);
            return JS_EXCEPTION;
        }
    }
    if (a < b) {
        start = a;
        end = b;
    } else {
        start = b;
        end = a;
    }
    ret = js_sub_string(ctx, p, start, end);
    JS_FreeValue(ctx, str);
    return ret;
}